

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int YUY2ToI422(uint8_t *src_yuy2,int src_stride_yuy2,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,
              int dst_stride_u,uint8_t *dst_v,int dst_stride_v,int width,int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *YUY2ToYRow;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *YUY2ToUV422Row;
  int y;
  int in_stack_00000020;
  code *local_48;
  code *pcVar2;
  int local_38;
  int local_34;
  long local_30;
  uint local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  pcVar2 = YUY2ToUV422Row_C;
  local_48 = YUY2ToYRow_C;
  if (((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
      ((YUY2ToUV422Row == (_func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *)0x0 ||
       ((int)(uint)dst_u < 1)))) || (in_stack_00000020 == 0)) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_stack_00000020 < 0) {
      in_stack_00000020 = -in_stack_00000020;
      local_10 = in_RDI + (in_stack_00000020 + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_34 = in_R9D;
    local_24 = in_ECX;
    if (((local_14 == (uint)dst_u * 2) && (in_ECX == (uint)dst_u)) &&
       ((in_R9D << 1 == (uint)dst_u &&
        ((y << 1 == (uint)dst_u && ((int)((uint)dst_u * in_stack_00000020) < 0x8001)))))) {
      dst_u._0_4_ = in_stack_00000020 * (uint)dst_u;
      in_stack_00000020 = 1;
      y = 0;
      local_34 = 0;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if (iVar1 != 0) {
      pcVar2 = YUY2ToUV422Row_Any_SSE2;
      local_48 = YUY2ToYRow_Any_SSE2;
      if (((uint)dst_u & 0xf) == 0) {
        pcVar2 = YUY2ToUV422Row_SSE2;
        local_48 = YUY2ToYRow_SSE2;
      }
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if (iVar1 != 0) {
      pcVar2 = YUY2ToUV422Row_Any_AVX2;
      local_48 = YUY2ToYRow_Any_AVX2;
      if (((uint)dst_u & 0x1f) == 0) {
        pcVar2 = YUY2ToUV422Row_AVX2;
        local_48 = YUY2ToYRow_AVX2;
      }
    }
    local_30 = in_R8;
    local_20 = in_RDX;
    for (local_38 = 0; local_38 < in_stack_00000020; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_30,YUY2ToUV422Row,(uint)dst_u);
      (*local_48)(local_10,local_20,(uint)dst_u);
      local_10 = local_10 + local_14;
      local_20 = local_20 + (int)local_24;
      local_30 = local_30 + local_34;
      YUY2ToUV422Row = YUY2ToUV422Row + y;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int YUY2ToI422(const uint8_t* src_yuy2,
               int src_stride_yuy2,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_u,
               int dst_stride_u,
               uint8_t* dst_v,
               int dst_stride_v,
               int width,
               int height) {
  int y;
  void (*YUY2ToUV422Row)(const uint8_t* src_yuy2, uint8_t* dst_u,
                         uint8_t* dst_v, int width) = YUY2ToUV422Row_C;
  void (*YUY2ToYRow)(const uint8_t* src_yuy2, uint8_t* dst_y, int width) =
      YUY2ToYRow_C;
  if (!src_yuy2 || !dst_y || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_yuy2 = src_yuy2 + (height - 1) * src_stride_yuy2;
    src_stride_yuy2 = -src_stride_yuy2;
  }
  // Coalesce rows.
  if (src_stride_yuy2 == width * 2 && dst_stride_y == width &&
      dst_stride_u * 2 == width && dst_stride_v * 2 == width &&
      width * height <= 32768) {
    width *= height;
    height = 1;
    src_stride_yuy2 = dst_stride_y = dst_stride_u = dst_stride_v = 0;
  }
#if defined(HAS_YUY2TOYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    YUY2ToUV422Row = YUY2ToUV422Row_Any_SSE2;
    YUY2ToYRow = YUY2ToYRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      YUY2ToUV422Row = YUY2ToUV422Row_SSE2;
      YUY2ToYRow = YUY2ToYRow_SSE2;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    YUY2ToUV422Row = YUY2ToUV422Row_Any_AVX2;
    YUY2ToYRow = YUY2ToYRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      YUY2ToUV422Row = YUY2ToUV422Row_AVX2;
      YUY2ToYRow = YUY2ToYRow_AVX2;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    YUY2ToYRow = YUY2ToYRow_Any_NEON;
    YUY2ToUV422Row = YUY2ToUV422Row_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      YUY2ToYRow = YUY2ToYRow_NEON;
      YUY2ToUV422Row = YUY2ToUV422Row_NEON;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_MMI) && defined(HAS_YUY2TOUV422ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    YUY2ToYRow = YUY2ToYRow_Any_MMI;
    YUY2ToUV422Row = YUY2ToUV422Row_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      YUY2ToYRow = YUY2ToYRow_MMI;
      YUY2ToUV422Row = YUY2ToUV422Row_MMI;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_MSA) && defined(HAS_YUY2TOUV422ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    YUY2ToYRow = YUY2ToYRow_Any_MSA;
    YUY2ToUV422Row = YUY2ToUV422Row_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      YUY2ToYRow = YUY2ToYRow_MSA;
      YUY2ToUV422Row = YUY2ToUV422Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    YUY2ToUV422Row(src_yuy2, dst_u, dst_v, width);
    YUY2ToYRow(src_yuy2, dst_y, width);
    src_yuy2 += src_stride_yuy2;
    dst_y += dst_stride_y;
    dst_u += dst_stride_u;
    dst_v += dst_stride_v;
  }
  return 0;
}